

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_sub_module_remove_devs_augs(lys_module *module)

{
  bool bVar1;
  byte local_12;
  byte local_11;
  uint8_t v;
  uint8_t u;
  lys_module *module_local;
  
  for (local_11 = 0; local_11 < module->deviation_size; local_11 = local_11 + 1) {
    remove_dev(module->deviation + local_11,module);
  }
  for (local_11 = 0; local_11 < module->augment_size; local_11 = local_11 + 1) {
    remove_aug(module->augment + local_11);
  }
  local_12 = 0;
  while( true ) {
    bVar1 = false;
    if (local_12 < module->inc_size) {
      bVar1 = module->inc[local_12].submodule != (lys_submodule *)0x0;
    }
    if (!bVar1) break;
    for (local_11 = 0; local_11 < (module->inc[local_12].submodule)->deviation_size;
        local_11 = local_11 + 1) {
      remove_dev((module->inc[local_12].submodule)->deviation + local_11,module);
    }
    for (local_11 = 0; local_11 < (module->inc[local_12].submodule)->augment_size;
        local_11 = local_11 + 1) {
      remove_aug((module->inc[local_12].submodule)->augment + local_11);
    }
    local_12 = local_12 + 1;
  }
  return;
}

Assistant:

void
lys_sub_module_remove_devs_augs(struct lys_module *module)
{
    uint8_t u, v;

    /* remove applied deviations */
    for (u = 0; u < module->deviation_size; ++u) {
        remove_dev(&module->deviation[u], module);
    }
    /* remove applied augments */
    for (u = 0; u < module->augment_size; ++u) {
        remove_aug(&module->augment[u]);
    }

    /* remove deviation and augments defined in submodules */
    for (v = 0; v < module->inc_size && module->inc[v].submodule; ++v) {
        for (u = 0; u < module->inc[v].submodule->deviation_size; ++u) {
            remove_dev(&module->inc[v].submodule->deviation[u], module);
        }

        for (u = 0; u < module->inc[v].submodule->augment_size; ++u) {
            remove_aug(&module->inc[v].submodule->augment[u]);
        }
    }
}